

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

Result<wallet::SelectionResult> *
wallet::coinselector_tests::CoinGrinder
          (Result<wallet::SelectionResult> *__return_storage_ptr__,CAmount *target,
          CoinSelectionParams *cs_params,NodeContext *m_node,int max_selection_weight,
          function<wallet::CoinsResult_(wallet::CWallet_&)> *coin_setup)

{
  mapped_type *pmVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  initializer_list<wallet::SelectionFilter> __l;
  Groups group;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  allocator_type local_149;
  vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> local_148;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> local_130;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> local_118;
  _Head_base<0UL,_kernel::Context_*,_false> local_100;
  _Head_base<0UL,_ECC_Context_*,_false> local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined8 uStack_e7;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_d8;
  undefined1 uStack_d0;
  undefined7 uStack_cf;
  undefined1 uStack_c8;
  undefined8 uStack_c7;
  bool local_b8;
  _Head_base<0UL,_ChainstateManager_*,_false> local_b0;
  ArgsManager *local_a0 [7];
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  local_68;
  _Manager_type local_38;
  
  local_38 = *(_Manager_type *)(in_FS_OFFSET + 0x28);
  local_b0._M_head_impl = (ChainstateManager *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  NewWallet((NodeContext *)&local_100,(string *)m_node);
  if (local_b0._M_head_impl != (ChainstateManager *)local_a0) {
    operator_delete(local_b0._M_head_impl,
                    (ulong)((long)&(local_a0[0]->cs_args).super_recursive_mutex.
                                   super___recursive_mutex_base._M_mutex + 1));
  }
  uStack_e8 = 0;
  uStack_e7 = 0;
  local_f8._M_head_impl = (ECC_Context *)0x0;
  uStack_f0 = 0;
  uStack_ef = 0;
  if ((coin_setup->super__Function_base)._M_manager == (_Manager_type)0x0) {
    if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar2 = std::__throw_bad_function_call();
      std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector
                ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)coin_setup);
      std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_130);
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)&local_100);
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar2);
      }
    }
  }
  else {
    (*coin_setup->_M_invoker)
              ((CoinsResult *)&local_b0,(_Any_data *)coin_setup,(CWallet *)local_100._M_head_impl);
    uStack_c8 = uStack_e8;
    uStack_c7 = uStack_e7;
    local_d8._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
    super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
         (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
         (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)local_f8._M_head_impl
    ;
    uStack_d0 = uStack_f0;
    uStack_cf = uStack_ef;
    local_b8 = true;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_d8;
    std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
              (&local_148,__l,&local_149);
    GroupOutputs((FilteredOutputGroups *)&local_68,(CWallet *)local_100._M_head_impl,
                 (CoinsResult *)&local_b0,cs_params,&local_148);
    pmVar1 = std::
             map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
             ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                           *)&local_68,(key_type *)&local_f8);
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::vector
              (&local_130,&(pmVar1->all_groups).positive_group);
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::vector
              (&local_118,&(pmVar1->all_groups).mixed_group);
    std::
    _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
    ::~_Rb_tree(&local_68);
    if (local_148.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.
                      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_148.
                            super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.
                            super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                 *)&local_b0);
    wallet::CoinGrinder(__return_storage_ptr__,&local_130,target,cs_params->m_min_change_target,
                        max_selection_weight);
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_118);
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_130);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)&local_100);
    if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> CoinGrinder(const CAmount& target,
                                                    const CoinSelectionParams& cs_params,
                                                    const node::NodeContext& m_node,
                                                    int max_selection_weight,
                                                    std::function<CoinsResult(CWallet&)> coin_setup)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    CoinEligibilityFilter filter(0, 0, 0); // accept all coins without ancestors
    Groups group = GroupOutputs(*wallet, coin_setup(*wallet), cs_params, {{filter}})[filter].all_groups;
    return CoinGrinder(group.positive_group, target, cs_params.m_min_change_target, max_selection_weight);
}